

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.h
# Opt level: O0

void __thiscall cmDefinePropertyCommand::~cmDefinePropertyCommand(cmDefinePropertyCommand *this)

{
  cmDefinePropertyCommand *this_local;
  
  ~cmDefinePropertyCommand(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

virtual cmCommand* Clone()
    {
      return new cmDefinePropertyCommand;
    }